

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.h
# Opt level: O0

UChar32 icu_63::CollationDataBuilder::jamoCpFromIndex(int32_t i)

{
  undefined4 local_c;
  int32_t i_local;
  
  if (i < 0x13) {
    local_c = i + 0x1100;
  }
  else if (i + -0x13 < 0x15) {
    local_c = i + 0x114e;
  }
  else {
    local_c = i + 0x1180;
  }
  return local_c;
}

Assistant:

static UChar32 jamoCpFromIndex(int32_t i) {
        // 0 <= i < CollationData::JAMO_CE32S_LENGTH = 19 + 21 + 27
        if(i < Hangul::JAMO_L_COUNT) { return Hangul::JAMO_L_BASE + i; }
        i -= Hangul::JAMO_L_COUNT;
        if(i < Hangul::JAMO_V_COUNT) { return Hangul::JAMO_V_BASE + i; }
        i -= Hangul::JAMO_V_COUNT;
        // i < 27
        return Hangul::JAMO_T_BASE + 1 + i;
    }